

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.hpp
# Opt level: O0

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::serializer<pstore::indirect_string,void>::
write_string_address<pstore::serialize::archive::database_writer&>
          (database_writer *archive,value_type *value)

{
  result_type rVar1;
  address local_30;
  undefined8 local_28;
  uint64_t mask;
  value_type *value_local;
  database_writer *archive_local;
  
  mask = (uint64_t)value;
  value_local = (value_type *)archive;
  if ((value->is_pointer_ & 1U) == 0) {
    assert_failed("value.is_pointer_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/indirect_string.hpp"
                  ,199);
  }
  local_28 = 1;
  if (((value->field_2).address_ & 1) == 0) {
    address::address(&local_30,(value->field_2).address_ | 1);
    rVar1 = serialize::archive::
            writer_base<pstore::serialize::archive::details::database_writer_policy>::
            put<pstore::address>
                      (&archive->
                        super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                       ,&local_30);
    return (archive_result_type<pstore::serialize::archive::database_writer_&>)rVar1.a_;
  }
  assert_failed("!(reinterpret_cast<std::uintptr_t> (value.str_) & mask)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/indirect_string.hpp"
                ,0xc9);
}

Assistant:

auto serializer<indirect_string>::write_string_address (DBArchive && archive,
                                                                value_type const & value)
            -> archive_result_type<DBArchive> {

            // The body of an indirect string must be written separately by the caller.
            PSTORE_ASSERT (value.is_pointer_);
            constexpr auto mask = indirect_string::in_heap_mask;
            PSTORE_ASSERT (!(reinterpret_cast<std::uintptr_t> (value.str_) & mask));

            return archive.put (address{reinterpret_cast<std::uintptr_t> (value.str_) | mask});
        }